

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# isotree.hpp
# Opt level: O3

void __thiscall
ImputedData<int,double>::ImputedData<InputData<float,int>>
          (ImputedData<int,double> *this,InputData<float,_int> *input_data,size_t row)

{
  memset(this,0,0xd8);
  initialize_impute_calc<ImputedData<int,double>,InputData<float,int>>
            ((ImputedData<int,_double> *)this,input_data,row);
  return;
}

Assistant:

ImputedData(InputData &input_data, size_t row)
    {
        initialize_impute_calc(*this, input_data, row);
    }